

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O1

int SUNLinSolSetPrintLevel_SPGMR(SUNLinearSolver S,int print_level)

{
  int iVar1;
  
  if (S == (SUNLinearSolver)0x0) {
    iVar1 = -0x321;
  }
  else {
    iVar1 = -0x322;
    if ((uint)print_level < 2) {
      *(int *)((long)S->content + 0xa0) = print_level;
      return 0;
    }
  }
  return iVar1;
}

Assistant:

int SUNLinSolSetPrintLevel_SPGMR(SUNLinearSolver S,
                                 int print_level)
{
  /* check that the linear solver is non-null */
  if (S == NULL)
    return(SUNLS_MEM_NULL);

  /* check for valid print level */
  if (print_level < 0 || print_level > 1)
    return(SUNLS_ILL_INPUT);

  SPGMR_CONTENT(S)->print_level = print_level;

  return(SUNLS_SUCCESS);
}